

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void polyscope::info(string *message)

{
  ostream *poVar1;
  
  if (0 < options::verbosity) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_004bdc60);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void info(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << message << std::endl;
  }
}